

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HApp.h
# Opt level: O0

HighsStatus returnFromSolveLpSimplex(HighsLpSolverObject *solver_object,HighsStatus return_status)

{
  long lVar1;
  HighsDebugStatus HVar2;
  HighsStatus in_ESI;
  long in_RDI;
  HighsInt alt_debug_level;
  HighsLp *incumbent_lp;
  HEkk *ekk_instance;
  HighsOptions *options;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  HEkk *in_stack_ffffffffffffff80;
  allocator local_59;
  string local_58 [12];
  HighsInt in_stack_ffffffffffffffb4;
  string *in_stack_ffffffffffffffb8;
  HEkk *in_stack_ffffffffffffffc0;
  HighsStatus local_14;
  HighsStatus local_4;
  
  lVar1 = *(long *)(in_RDI + 0x30);
  *(undefined4 *)(*(long *)(in_RDI + 0x18) + 0x18) =
       *(undefined4 *)(*(long *)(in_RDI + 0x20) + 0x36f8);
  if (in_ESI == kError) {
    HEkk::clear(in_stack_ffffffffffffff80);
    local_4 = in_ESI;
  }
  else {
    HEkk::setNlaPointersForLpAndScale
              (in_stack_ffffffffffffff80,
               (HighsLp *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"HApp: returnFromSolveLpSimplex",&local_59);
    HVar2 = HEkk::debugNlaCheckInvert
                      (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4
                      );
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    local_14 = in_ESI;
    if (HVar2 == kError) {
      highsLogUser((HighsLogOptions *)(lVar1 + 0x380),kError,
                   "Error in basis matrix inverse after solving the LP\n");
      local_14 = kError;
    }
    if (*(int *)(in_RDI + 0x40) == 7) {
      *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x88) = 0;
      *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x90) = 0;
    }
    local_4 = local_14;
  }
  return local_4;
}

Assistant:

inline HighsStatus returnFromSolveLpSimplex(HighsLpSolverObject& solver_object,
                                            HighsStatus return_status) {
  HighsOptions& options = solver_object.options_;
  HEkk& ekk_instance = solver_object.ekk_instance_;
  HighsLp& incumbent_lp = solver_object.lp_;
  // Copy the simplex iteration count to highs_info_ from ekk_instance
  solver_object.highs_info_.simplex_iteration_count =
      ekk_instance.iteration_count_;
  // Ensure that the incumbent LP is neither moved, nor scaled
  assert(!incumbent_lp.is_moved_);
  assert(!incumbent_lp.is_scaled_);
  // Cannot expect any more with an error return, and safer to clear
  // HEkk than try to retain any data
  if (return_status == HighsStatus::kError) {
    ekk_instance.clear();
    return return_status;
  }
  //
  // Ensure that there is an invert for the current LP
  assert(ekk_instance.status_.has_invert);
  // Ensure that simplex NLA is set up
  assert(ekk_instance.status_.has_nla);
  // Set the simplex NLA scaling
  ekk_instance.setNlaPointersForLpAndScale(incumbent_lp);
  assert(ekk_instance.debugNlaScalingOk(incumbent_lp));
  HighsInt alt_debug_level = -1;
  // Forced expensive debug for development work
  //  alt_debug_level = kHighsDebugLevelExpensive;
  if (ekk_instance.debugNlaCheckInvert("HApp: returnFromSolveLpSimplex",
                                       alt_debug_level) ==
      HighsDebugStatus::kError) {
    highsLogUser(options.log_options, HighsLogType::kError,
                 "Error in basis matrix inverse after solving the LP\n");
    return_status = HighsStatus::kError;
  }
  if (solver_object.model_status_ == HighsModelStatus::kOptimal) {
    solver_object.highs_info_.max_complementarity_violation = 0;
    solver_object.highs_info_.sum_complementarity_violations = 0;
  }
  return return_status;
}